

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O0

void store_ref_to_cpb(EncVirtualCpb *cpb,EncFrmStatus *frm)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 uVar5;
  undefined4 uVar6;
  EncFrmStatus *pEStack_38;
  RK_S32 cpb_idx;
  EncFrmStatus *cpb_ref;
  int local_28;
  RK_S32 found;
  RK_S32 i;
  RK_S32 tid;
  RK_S32 lt_idx;
  RK_S32 seq_idx;
  EncFrmStatus *frm_local;
  EncVirtualCpb *cpb_local;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  uVar1 = (uint)(ushort)(frm->val >> 0x30);
  uVar2 = (uint)(frm->val >> 8) & 0xf;
  uVar3 = (uint)(frm->val >> 0xc) & 0xf;
  if ((frm->val & 1) == 0) {
    uVar5 = CONCAT44(uVar6,0x1ff);
    _mpp_log_l(2,"mpp_enc_refs","Assertion %s failed at %s:%d\n",(char *)0x0,"frm->valid",
               "store_ref_to_cpb",uVar5);
    uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
    if ((mpp_debug & 0x10000000) != 0) {
      abort();
    }
  }
  if (0xf < uVar2) {
    uVar5 = CONCAT44(uVar6,0x200);
    _mpp_log_l(2,"mpp_enc_refs","Assertion %s failed at %s:%d\n",(char *)0x0,"lt_idx < 16",
               "store_ref_to_cpb",uVar5);
    uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
    if ((mpp_debug & 0x10000000) != 0) {
      abort();
    }
  }
  if ((0xf < uVar3) &&
     (_mpp_log_l(2,"mpp_enc_refs","Assertion %s failed at %s:%d\n",(char *)0x0,"tid < 16",
                 "store_ref_to_cpb",CONCAT44(uVar6,0x201)), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((frm->val >> 6 & 1) == 0) {
    if ((frm->val >> 4 & 1) != 0) {
      cpb->mode_refs[3] = *frm;
    }
    if ((frm->val >> 7 & 1) == 0) {
      cpb->st_tid_refs[(int)uVar3] = *frm;
      cpb->mode_refs[0] = *frm;
      cpb->mode_refs[1] = *frm;
      for (local_28 = 0xf; 0 < local_28; local_28 = local_28 + -1) {
        cpb->cpb_refs[local_28] = cpb->cpb_refs[local_28 + -1];
      }
      cpb->cpb_refs[0] = *frm;
    }
    else {
      cpb->lt_idx_refs[(int)uVar2] = *frm;
      cpb->st_tid_refs[(int)uVar3] = *frm;
      cpb->mode_refs[0] = *frm;
      cpb->mode_refs[2] = *frm;
      cpb_ref._4_4_ = 0;
      pEStack_38 = (EncFrmStatus *)0x0;
      for (local_28 = 0; local_28 < 0x10; local_28 = local_28 + 1) {
        pEStack_38 = cpb->cpb_refs + (local_28 + 0x10);
        if ((pEStack_38->val & 1) == 0) {
          cpb_ref._4_4_ = 1;
          break;
        }
        if (((uint)(pEStack_38->val >> 8) & 0xf) == uVar2) {
          cpb_ref._4_4_ = 2;
          break;
        }
      }
      if (cpb_ref._4_4_ == 0) {
        _mpp_log_l(2,"mpp_enc_refs","frm %d with lt idx %d found no place to add or relace\n",
                   "store_ref_to_cpb",(ulong)uVar1,(ulong)uVar2);
      }
      else {
        *pEStack_38 = *frm;
        if ((enc_refs_debug & 2) != 0) {
          pcVar4 = "replace";
          if (cpb_ref._4_4_ == 1) {
            pcVar4 = "add";
          }
          _mpp_log_l(4,"mpp_enc_refs","frm %d with lt idx %d %s to pos %d\n","store_ref_to_cpb",
                     (ulong)uVar1,(ulong)uVar2,pcVar4,local_28);
        }
      }
    }
    if ((enc_refs_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","dumping cpb refs status start\n","store_ref_to_cpb");
    }
    if ((enc_refs_debug & 2) != 0) {
      for (local_28 = 0; local_28 < 0x20; local_28 = local_28 + 1) {
        if ((cpb->cpb_refs[local_28].val & 1) != 0) {
          _dump_frm(cpb->cpb_refs + local_28,"store_ref_to_cpb",0x23d);
        }
      }
    }
    if ((enc_refs_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_enc_refs","dumping cpb refs status done\n","store_ref_to_cpb");
    }
  }
  return;
}

Assistant:

static void store_ref_to_cpb(EncVirtualCpb *cpb, EncFrmStatus *frm)
{
    RK_S32 seq_idx = frm->seq_idx;
    RK_S32 lt_idx = frm->lt_idx;
    RK_S32 tid = frm->temporal_id;
    RK_S32 i;

    mpp_assert(frm->valid);
    mpp_assert(lt_idx < MAX_CPB_LT_IDX);
    mpp_assert(tid < MAX_CPB_LT_FRM);

    /* non-ref do not save to cpb */
    if (frm->is_non_ref)
        return ;

    if (frm->is_intra)
        cpb->mode_refs[REF_TO_PREV_INTRA].val = frm->val;

    if (frm->is_lt_ref) {
        cpb->lt_idx_refs[lt_idx].val = frm->val;
        cpb->st_tid_refs[tid].val = frm->val;
        cpb->mode_refs[REF_TO_PREV_REF_FRM].val = frm->val;
        cpb->mode_refs[REF_TO_PREV_LT_REF].val = frm->val;

        RK_S32 found = 0;
        EncFrmStatus *cpb_ref = NULL;

        /* find same lt_idx and replace */
        for (i = 0; i < MAX_CPB_LT_FRM; i++) {
            RK_S32 cpb_idx = i + MAX_CPB_ST_FRM;
            cpb_ref = &cpb->cpb_refs[cpb_idx];

            if (!cpb_ref->valid) {
                found = 1;
                break;
            } else {
                if (cpb_ref->lt_idx == lt_idx) {
                    found = 2;
                    break;
                }
            }
        }

        if (found) {
            cpb_ref->val = frm->val;
            enc_refs_dbg_flow("frm %d with lt idx %d %s to pos %d\n",
                              seq_idx, lt_idx, (found == 1) ? "add" : "replace", i);
        } else {
            mpp_err_f("frm %d with lt idx %d found no place to add or relace\n",
                      seq_idx, lt_idx);
        }
    } else {
        /* do normal st sliding window */
        cpb->st_tid_refs[tid].val = frm->val;
        cpb->mode_refs[REF_TO_PREV_REF_FRM].val = frm->val;
        cpb->mode_refs[REF_TO_PREV_ST_REF].val = frm->val;

        for (i = MAX_CPB_ST_FRM - 1; i > 0; i--)
            cpb->cpb_refs[i].val = cpb->cpb_refs[i - 1].val;

        cpb->cpb_refs[0].val = frm->val;

        // TODO: Add prev intra valid check?
    }

    enc_refs_dbg_flow("dumping cpb refs status start\n");
    if (enc_refs_debug & MPP_ENC_REFS_DBG_FLOW)
        for (i = 0; i < MAX_CPB_FRM; i++)
            if (cpb->cpb_refs[i].valid)
                dump_frm(&cpb->cpb_refs[i]);

    enc_refs_dbg_flow("dumping cpb refs status done\n");
}